

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O2

void CRYPTO_poly1305_finish(poly1305_state *state,uint8_t *mac)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong *puVar34;
  ulong uVar35;
  uint uVar37;
  undefined1 auVar36 [16];
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [12];
  uint uVar44;
  undefined1 auVar43 [16];
  ulong uVar45;
  uint uVar46;
  undefined1 auVar47 [12];
  uint uVar50;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ulong uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong uVar62;
  ulong uVar63;
  undefined1 auVar64 [16];
  ulong uVar65;
  undefined1 auVar66 [16];
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar72;
  undefined1 auVar71 [16];
  ulong local_90;
  ulong *local_88;
  ulong uStack_80;
  ulong local_78;
  undefined1 auVar70 [12];
  
  uVar29 = (ulong)(*state + 0x3f) & 0xffffffffffffffc0;
  local_90 = *(ulong *)(uVar29 + 0x178);
  puVar34 = (ulong *)(uVar29 + 0x180);
  if (*(long *)(uVar29 + 0x170) == 0) {
    uVar35 = *(ulong *)(uVar29 + 0x120);
    uVar56 = *(ulong *)(uVar29 + 0x128);
    uVar38 = *(ulong *)(uVar29 + 0x130);
  }
  else {
    auVar36 = *(undefined1 (*) [16])(uVar29 + 0x120);
    auVar43 = *(undefined1 (*) [16])(uVar29 + 0x130);
    auVar70 = auVar43._0_12_;
    auVar48 = *(undefined1 (*) [16])(uVar29 + 0x140);
    auVar42 = auVar48._0_12_;
    auVar49 = *(undefined1 (*) [16])(uVar29 + 0x150);
    auVar47 = auVar49._0_12_;
    uVar27 = *(uint *)(uVar29 + 0x160);
    local_88 = *(ulong **)(uVar29 + 0x160);
    uVar28 = *(uint *)(uVar29 + 0x168);
    uStack_80 = *(ulong *)(uVar29 + 0x168);
    if (local_90 < 0x20) {
      lVar26 = 0;
    }
    else {
      uVar38 = *(ulong *)(uVar29 + 0x90);
      uVar57 = *(ulong *)(uVar29 + 0x98);
      uVar41 = *(ulong *)(uVar29 + 0xa0);
      uVar63 = *(ulong *)(uVar29 + 0xa8);
      uVar65 = *(ulong *)(uVar29 + 0xb0);
      uVar32 = *(ulong *)(uVar29 + 0xb8);
      uVar31 = auVar36._0_4_;
      uVar37 = auVar36._8_4_;
      uVar33 = *(ulong *)(uVar29 + 0x110);
      uVar25 = *(ulong *)(uVar29 + 0x118);
      uVar69 = auVar43._0_4_;
      uVar72 = auVar43._8_4_;
      uVar40 = *(ulong *)(uVar29 + 0x100);
      uVar45 = *(ulong *)(uVar29 + 0x108);
      uVar39 = auVar48._0_4_;
      uVar44 = auVar48._8_4_;
      uVar46 = auVar49._0_4_;
      uVar50 = auVar49._8_4_;
      uVar35 = *(ulong *)(uVar29 + 400);
      uVar56 = *(ulong *)(uVar29 + 0x180);
      auVar59._8_8_ = uVar35;
      auVar59._0_8_ = uVar56;
      auVar48._0_8_ =
           SUB168(auVar59 & _DAT_00321750,0) +
           (*(ulong *)(uVar29 + 0xe0) & 0xffffffff) * (ulong)uVar27 +
           (*(ulong *)(uVar29 + 0xf0) & 0xffffffff) * (ulong)uVar46 +
           (uVar40 & 0xffffffff) * (ulong)uVar39 +
           (uVar33 & 0xffffffff) * (ulong)uVar69 + (uVar38 & 0xffffffff) * (ulong)uVar31;
      auVar48._8_8_ =
           SUB168(auVar59 & _DAT_00321750,8) +
           (*(ulong *)(uVar29 + 0xe8) & 0xffffffff) * (ulong)uVar28 +
           (*(ulong *)(uVar29 + 0xf8) & 0xffffffff) * (ulong)uVar50 +
           (uVar45 & 0xffffffff) * (ulong)uVar44 +
           (uVar25 & 0xffffffff) * (ulong)uVar72 + (uVar57 & 0xffffffff) * (ulong)uVar37;
      auVar66._0_8_ = uVar56 >> 0x1a;
      auVar66._8_8_ = uVar35 >> 0x1a;
      auVar60._0_8_ = uVar56 >> 0x34;
      auVar60._8_8_ = uVar35 >> 0x34;
      auVar52._0_8_ = *(ulong *)(uVar29 + 0x188) << 0xc;
      auVar52._8_8_ = *(ulong *)(uVar29 + 0x198) << 0xc;
      auVar52 = auVar52 | auVar60;
      auVar53._0_8_ = auVar52._0_8_ >> 0x1a;
      auVar53._8_8_ = auVar52._8_8_ >> 0x1a;
      local_78 = auVar36._0_8_;
      auVar54._0_8_ =
           SUB168(auVar53 & _DAT_00321750,0) + (uVar33 & 0xffffffff) * (ulong)uVar27 +
           (uVar38 & 0xffffffff) * (ulong)uVar46 + (uVar41 & 0xffffffff) * (ulong)uVar39 +
           (uVar65 & 0xffffffff) * (ulong)uVar69 +
           (*(ulong *)(uVar29 + 0xc0) & 0xffffffff) * (ulong)uVar31;
      auVar54._8_8_ =
           SUB168(auVar53 & _DAT_00321750,8) + (uVar25 & 0xffffffff) * (ulong)uVar28 +
           (uVar57 & 0xffffffff) * (ulong)uVar50 + (uVar63 & 0xffffffff) * (ulong)uVar44 +
           (uVar32 & 0xffffffff) * (ulong)uVar72 +
           (*(ulong *)(uVar29 + 200) & 0xffffffff) * (ulong)uVar37;
      auVar64._0_8_ =
           (auVar48._0_8_ >> 0x1a) +
           SUB168(auVar66 & _DAT_00321750,0) +
           (*(ulong *)(uVar29 + 0xf0) & 0xffffffff) * (ulong)uVar27 +
           (uVar40 & 0xffffffff) * (ulong)uVar46 + (uVar33 & 0xffffffff) * (ulong)uVar39 +
           (uVar38 & 0xffffffff) * (ulong)uVar69 + (uVar41 & 0xffffffff) * (ulong)uVar31;
      auVar64._8_8_ =
           (auVar48._8_8_ >> 0x1a) +
           SUB168(auVar66 & _DAT_00321750,8) +
           (*(ulong *)(uVar29 + 0xf8) & 0xffffffff) * (ulong)uVar28 +
           (uVar45 & 0xffffffff) * (ulong)uVar50 + (uVar25 & 0xffffffff) * (ulong)uVar44 +
           (uVar57 & 0xffffffff) * (ulong)uVar72 + (uVar63 & 0xffffffff) * (ulong)uVar37;
      auVar61._0_8_ =
           (auVar54._0_8_ >> 0x1a) +
           (*(ulong *)(uVar29 + 0x188) >> 0x28) +
           (local_78 & 0xffffffff) * (ulong)*(uint *)(uVar29 + 0xd0) +
           (uVar38 & 0xffffffff) * (ulong)uVar27 + (uVar41 & 0xffffffff) * (ulong)uVar46 +
           (uVar65 & 0xffffffff) * (ulong)uVar39 +
           (*(ulong *)(uVar29 + 0xc0) & 0xffffffff) * (ulong)uVar69 + 0x1000000;
      auVar61._8_8_ =
           (auVar54._8_8_ >> 0x1a) +
           (*(ulong *)(uVar29 + 0x198) >> 0x28) +
           (auVar36._8_8_ & 0xffffffff) * (ulong)*(uint *)(uVar29 + 0xd8) +
           (uVar57 & 0xffffffff) * (ulong)uVar28 + (uVar63 & 0xffffffff) * (ulong)uVar50 +
           (uVar32 & 0xffffffff) * (ulong)uVar44 +
           (*(ulong *)(uVar29 + 200) & 0xffffffff) * (ulong)uVar72 + 0x1000000;
      auVar43._0_8_ =
           (auVar64._0_8_ >> 0x1a) +
           SUB168(auVar52 & _DAT_00321750,0) + (uVar40 & 0xffffffff) * (ulong)uVar27 +
           (uVar33 & 0xffffffff) * (ulong)uVar46 + (uVar65 & 0xffffffff) * (ulong)uVar31 +
           (uVar38 & 0xffffffff) * (ulong)uVar39 + (uVar41 & 0xffffffff) * (ulong)uVar69;
      auVar43._8_8_ =
           (auVar64._8_8_ >> 0x1a) +
           SUB168(auVar52 & _DAT_00321750,8) + (uVar45 & 0xffffffff) * (ulong)uVar28 +
           (uVar25 & 0xffffffff) * (ulong)uVar50 + (uVar32 & 0xffffffff) * (ulong)uVar37 +
           (uVar57 & 0xffffffff) * (ulong)uVar44 + (uVar63 & 0xffffffff) * (ulong)uVar72;
      auVar36._0_8_ = (auVar61._0_8_ >> 0x1a & 0xffffffff) * 5 + SUB168(auVar48 & _DAT_00321750,0);
      auVar36._8_8_ = (auVar61._8_8_ >> 0x1a & 0xffffffff) * 5 + SUB168(auVar48 & _DAT_00321750,8);
      auVar49._0_8_ = (auVar43._0_8_ >> 0x1a) + SUB168(auVar54 & _DAT_00321750,0);
      auVar49._8_8_ = (auVar43._8_8_ >> 0x1a) + SUB168(auVar54 & _DAT_00321750,8);
      auVar71._0_8_ = (auVar36._0_8_ >> 0x1a) + SUB168(auVar64 & _DAT_00321750,0);
      auVar71._8_8_ = (auVar36._8_8_ >> 0x1a) + SUB168(auVar64 & _DAT_00321750,8);
      auVar70 = auVar71._0_12_;
      local_88 = (ulong *)((auVar49._0_8_ >> 0x1a) + SUB168(auVar61 & _DAT_00321750,0));
      uStack_80 = (auVar49._8_8_ >> 0x1a) + SUB168(auVar61 & _DAT_00321750,8);
      auVar42 = auVar43._0_12_ & DAT_00321750._0_12_;
      auVar36 = auVar36 & _DAT_00321750;
      auVar47 = auVar49._0_12_ & DAT_00321750._0_12_;
      lVar26 = 0x20;
    }
    *(uint *)(uVar29 + 0x98) = *(uint *)(uVar29 + 0x94) & 0x3ffffff;
    uVar28 = ((uint)(CONCAT44(*(undefined4 *)(uVar29 + 0x9c),*(uint *)(uVar29 + 0x94)) >> 0x1a) |
             *(int *)(uVar29 + 0xa4) << 0x12) & 0x3ffffff;
    *(uint *)(uVar29 + 0xa8) = uVar28;
    uVar27 = (uint)(CONCAT44(*(uint *)(uVar29 + 0xac),*(int *)(uVar29 + 0xa4)) >> 8) & 0x3ffffff;
    *(uint *)(uVar29 + 0xb8) = uVar27;
    uVar31 = (*(int *)(uVar29 + 0xb4) << 10 | *(uint *)(uVar29 + 0xac) >> 2) & 0x3ffffff;
    *(uint *)(uVar29 + 200) = uVar31;
    iVar30 = (int)(CONCAT44(*(undefined4 *)(uVar29 + 0xbc),*(int *)(uVar29 + 0xb4)) >> 0x10);
    *(int *)(uVar29 + 0xd8) = iVar30;
    *(uint *)(uVar29 + 0xe8) = uVar28 * 5;
    *(uint *)(uVar29 + 0xf8) = uVar27 * 5;
    *(uint *)(uVar29 + 0x108) = uVar31 * 5;
    *(int *)(uVar29 + 0x118) = iVar30 * 5;
    uVar35 = *(ulong *)(uVar29 + 0x90);
    uVar56 = *(ulong *)(uVar29 + 0x98);
    uVar27 = auVar36._0_4_;
    uVar28 = auVar36._8_4_;
    uVar38 = *(ulong *)(uVar29 + 0xa0);
    uVar57 = *(ulong *)(uVar29 + 0xa8);
    uVar41 = *(ulong *)(uVar29 + 0xb0);
    uVar63 = *(ulong *)(uVar29 + 0xb8);
    uVar65 = *(ulong *)(uVar29 + 0x110);
    uVar32 = *(ulong *)(uVar29 + 0x118);
    uVar46 = auVar70._0_4_;
    uVar50 = auVar70._8_4_;
    uVar33 = *(ulong *)(uVar29 + 0x100);
    uVar25 = *(ulong *)(uVar29 + 0x108);
    uVar31 = auVar42._0_4_;
    uVar37 = auVar42._8_4_;
    uVar39 = auVar47._0_4_;
    uVar44 = auVar47._8_4_;
    uVar67 = (*(ulong *)(uVar29 + 0xe0) & 0xffffffff) * ((ulong)local_88 & 0xffffffff) +
             (*(ulong *)(uVar29 + 0xf0) & 0xffffffff) * (ulong)uVar39 +
             (uVar33 & 0xffffffff) * (ulong)uVar31 +
             (uVar65 & 0xffffffff) * (ulong)uVar46 + (uVar35 & 0xffffffff) * (ulong)uVar27;
    uVar68 = (*(ulong *)(uVar29 + 0xe8) & 0xffffffff) * (uStack_80 & 0xffffffff) +
             (*(ulong *)(uVar29 + 0xf8) & 0xffffffff) * (ulong)uVar44 +
             (uVar25 & 0xffffffff) * (ulong)uVar37 +
             (uVar32 & 0xffffffff) * (ulong)uVar50 + (uVar56 & 0xffffffff) * (ulong)uVar28;
    uVar58 = (uVar65 & 0xffffffff) * ((ulong)local_88 & 0xffffffff) +
             (uVar35 & 0xffffffff) * (ulong)uVar39 + (uVar38 & 0xffffffff) * (ulong)uVar31 +
             (uVar41 & 0xffffffff) * (ulong)uVar46 +
             (*(ulong *)(uVar29 + 0xc0) & 0xffffffff) * (ulong)uVar27;
    uVar62 = (uVar32 & 0xffffffff) * (uStack_80 & 0xffffffff) +
             (uVar56 & 0xffffffff) * (ulong)uVar44 + (uVar57 & 0xffffffff) * (ulong)uVar37 +
             (uVar63 & 0xffffffff) * (ulong)uVar50 +
             (*(ulong *)(uVar29 + 200) & 0xffffffff) * (ulong)uVar28;
    uVar51 = (uVar67 >> 0x1a) +
             (*(ulong *)(uVar29 + 0xf0) & 0xffffffff) * ((ulong)local_88 & 0xffffffff) +
             (uVar33 & 0xffffffff) * (ulong)uVar39 + (uVar65 & 0xffffffff) * (ulong)uVar31 +
             (uVar35 & 0xffffffff) * (ulong)uVar46 + (uVar38 & 0xffffffff) * (ulong)uVar27;
    uVar55 = (uVar68 >> 0x1a) +
             (*(ulong *)(uVar29 + 0xf8) & 0xffffffff) * (uStack_80 & 0xffffffff) +
             (uVar25 & 0xffffffff) * (ulong)uVar44 + (uVar32 & 0xffffffff) * (ulong)uVar37 +
             (uVar56 & 0xffffffff) * (ulong)uVar50 + (uVar57 & 0xffffffff) * (ulong)uVar28;
    uVar40 = (uVar58 >> 0x1a) +
             (uVar35 & 0xffffffff) * ((ulong)local_88 & 0xffffffff) +
             (uVar38 & 0xffffffff) * (ulong)uVar39 +
             (uVar41 & 0xffffffff) * (ulong)uVar31 +
             (*(ulong *)(uVar29 + 0xc0) & 0xffffffff) * (ulong)uVar46 +
             (ulong)uVar27 * (ulong)*(uint *)(uVar29 + 0xd0);
    uVar45 = (uVar62 >> 0x1a) +
             (uVar56 & 0xffffffff) * (uStack_80 & 0xffffffff) +
             (uVar57 & 0xffffffff) * (ulong)uVar44 +
             (uVar63 & 0xffffffff) * (ulong)uVar37 +
             (*(ulong *)(uVar29 + 200) & 0xffffffff) * (ulong)uVar50 +
             (auVar36._8_8_ & 0xffffffff) * (ulong)*(uint *)(uVar29 + 0xd8);
    uVar35 = (uVar51 >> 0x1a) +
             (uVar33 & 0xffffffff) * ((ulong)local_88 & 0xffffffff) +
             (uVar65 & 0xffffffff) * (ulong)uVar39 + (uVar41 & 0xffffffff) * (ulong)uVar27 +
             (uVar35 & 0xffffffff) * (ulong)uVar31 + (uVar38 & 0xffffffff) * (ulong)uVar46;
    uVar38 = (uVar55 >> 0x1a) +
             (uVar25 & 0xffffffff) * (uStack_80 & 0xffffffff) +
             (uVar32 & 0xffffffff) * (ulong)uVar44 + (uVar63 & 0xffffffff) * (ulong)uVar28 +
             (uVar56 & 0xffffffff) * (ulong)uVar37 + (uVar57 & 0xffffffff) * (ulong)uVar50;
    uVar56 = (uVar40 >> 0x1a & 0xffffffff) * 5 + (uVar67 & 0x3ffffff);
    uVar57 = (uVar45 >> 0x1a & 0xffffffff) * 5 + (uVar68 & 0x3ffffff);
    uVar63 = (uVar35 >> 0x1a) + (uVar58 & 0x3ffffff);
    uVar65 = (uVar38 >> 0x1a) + (uVar62 & 0x3ffffff);
    uVar41 = (uVar57 & 0x3ffffff) + (uVar56 & 0x3ffffff);
    uVar56 = (long)(int)((int)((uVar57 >> 0x1a) + (uVar55 & 0x3ffffff)) +
                        (int)(uVar56 >> 0x1a) + ((uint)uVar51 & 0x3ffffff)) + (uVar41 >> 0x1a);
    uVar38 = (uVar38 & 0x3ffffff) + (uVar35 & 0x3ffffff) + (uVar56 >> 0x1a);
    uVar35 = (uVar65 & 0x3ffffff) + (uVar63 & 0x3ffffff) + (uVar38 >> 0x1a);
    uVar27 = (uint)uVar35;
    uVar57 = (long)(int)((int)((uVar65 >> 0x1a) + (uVar45 & 0x3ffffff)) +
                        (int)(uVar63 >> 0x1a) + ((uint)uVar40 & 0x3ffffff)) + (uVar35 >> 0x1a);
    uVar35 = (uVar57 >> 0x1a) * 5 + (ulong)((uint)uVar41 & 0x3ffffff);
    uVar56 = (uVar35 >> 0x1a) + (uVar56 & 0x3ffffff);
    uVar35 = uVar56 * 0x4000000 & 0xffffc000000 | uVar35 & 0x3ffffff;
    *(ulong *)(uVar29 + 0x120) = uVar35;
    uVar56 = (ulong)(uVar27 & 0x3ff) << 0x22 | (uVar38 & 0x3ffffff) << 8 | uVar56 >> 0x12;
    *(ulong *)(uVar29 + 0x128) = uVar56;
    uVar38 = uVar57 * 0x10000 & 0x3ffffff0000 | (ulong)((uVar27 & 0x3fffc00) >> 10);
    *(ulong *)(uVar29 + 0x130) = uVar38;
    local_90 = local_90 - lVar26;
    puVar34 = (ulong *)((long)puVar34 + lVar26);
  }
  uVar41 = CONCAT44(*(undefined4 *)(uVar29 + 0x9c),*(undefined4 *)(uVar29 + 0x94));
  uVar63 = CONCAT44(*(undefined4 *)(uVar29 + 0xac),*(undefined4 *)(uVar29 + 0xa4));
  uVar65 = CONCAT44(*(undefined4 *)(uVar29 + 0xbc),*(undefined4 *)(uVar29 + 0xb4));
  uVar57 = uVar65 * 0x14;
  if (local_90 < 0x10) goto LAB_00260f52;
  do {
    uVar35 = (*puVar34 & 0xfffffffffff) + uVar35;
    uVar56 = (*puVar34 >> 0x2c | (puVar34[1] & 0xffffff) << 0x14) + uVar56;
    uVar38 = uVar38 + 0x10000000000 + (puVar34[1] >> 0x18);
    local_88 = puVar34;
    while( true ) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar35;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar41;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar56;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar57;
      auVar20._8_8_ = SUB168(auVar3 * auVar12,8);
      auVar20._0_8_ = SUB168(auVar3 * auVar12,0) & 0xfffffffffffffffc;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar38;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar63 * 0x14;
      auVar21._8_8_ = SUB168(auVar4 * auVar13,8);
      auVar21._0_8_ = SUB168(auVar4 * auVar13,0) & 0xfffffffffffffffc;
      auVar21 = auVar2 * auVar11 + auVar20 + auVar21;
      uVar32 = auVar21._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar35;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar63;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar56;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar41;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar38;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar57;
      auVar22._8_8_ = SUB168(auVar7 * auVar16,8);
      auVar22._0_8_ = SUB168(auVar7 * auVar16,0) & 0xfffffffffffffffc;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar35;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar65;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar56;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar63;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar38;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar41;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = auVar21._8_8_ << 0x14 | uVar32 >> 0x2c;
      auVar23 = auVar6 * auVar15 + auVar5 * auVar14 + auVar22 + auVar23;
      uVar56 = auVar23._0_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar23._8_8_ << 0x14 | uVar56 >> 0x2c;
      uVar56 = uVar56 & 0xfffffffffff;
      auVar24 = auVar9 * auVar18 + auVar8 * auVar17 + auVar10 * auVar19 + auVar24;
      uVar38 = auVar24._0_8_;
      uVar35 = (auVar24._8_8_ << 0x16 | uVar38 >> 0x2a) * 5 + (uVar32 & 0xfffffffffff);
      uVar38 = uVar38 & 0x3ffffffffff;
      puVar34 = local_88 + 2;
      local_90 = local_90 - 0x10;
      if (0xf < local_90) break;
LAB_00260f52:
      if (local_90 == 0) {
        uVar56 = (uVar35 >> 0x2c) + uVar56;
        uVar57 = uVar56 & 0xfffffffffff;
        uVar38 = (uVar56 >> 0x2c) + uVar38;
        lVar26 = (uVar38 >> 0x2a) * 5;
        uVar56 = lVar26 + (uVar35 & 0xfffffffffff) + 5;
        uVar65 = (uVar56 >> 0x2c) + uVar57;
        uVar32 = (uVar65 >> 0x2c) + (uVar38 & 0x3ffffffffff);
        uVar33 = (long)(uVar32 - 0x40000000000) >> 0x3f;
        uVar63 = 0xffffffffffffffff - uVar33 & 0xfffffffffff;
        uVar41 = (ulong)*(uint *)(uVar29 + 0xcc) << 0x20;
        uVar1 = *(undefined4 *)(uVar29 + 0xdc);
        uVar27 = *(uint *)(uVar29 + 0xd4);
        uVar35 = (uVar41 & 0xfff00000000 | (ulong)*(uint *)(uVar29 + 0xc4)) +
                 (uVar56 & uVar63 | lVar26 + (uVar35 & 0xfffffffffff) & uVar33);
        uVar29 = (uVar41 >> 0x2c | ((ulong)uVar27 & 0xffffff) << 0x14) +
                 (uVar63 & uVar65 | uVar57 & uVar33) + (uVar35 >> 0x2c);
        *(ulong *)mac = uVar29 << 0x2c | uVar35 & 0xfffffffffff;
        *(ulong *)(mac + 8) =
             ((CONCAT44(uVar1,uVar27) >> 0x18) +
              (0xffffffffffffffff - uVar33 & uVar32 | uVar33 & uVar38) + (uVar29 >> 0x2c)) *
             0x1000000 | (ulong)((uint)(uVar29 >> 0x14) & 0xffffff);
        return;
      }
      *(undefined1 *)((long)puVar34 + local_90) = 1;
      if (local_90 != 0xf) {
        memset((void *)((long)puVar34 + local_90 + 1),0,local_90 ^ 0xf);
      }
      uVar35 = (*puVar34 & 0xfffffffffff) + uVar35;
      uVar56 = (*puVar34 >> 0x2c | (puVar34[1] & 0xffffff) << 0x14) + uVar56;
      uVar38 = (puVar34[1] >> 0x18) + uVar38;
      local_90 = 0x10;
      local_88 = puVar34;
    }
  } while( true );
}

Assistant:

void CRYPTO_poly1305_finish(poly1305_state *state, uint8_t mac[16]) {
  poly1305_state_internal *st = poly1305_aligned_state(state);
  size_t leftover = st->leftover;
  uint8_t *m = st->buffer;
  uint128_t d[3];
  uint64_t h0, h1, h2;
  uint64_t t0, t1;
  uint64_t g0, g1, g2, c, nc;
  uint64_t r0, r1, r2, s1, s2;
  poly1305_power *p;

  if (st->started) {
    size_t consumed = poly1305_combine(st, m, leftover);
    leftover -= consumed;
    m += consumed;
  }

  // st->HH will either be 0 or have the combined result
  h0 = st->HH[0];
  h1 = st->HH[1];
  h2 = st->HH[2];

  p = &st->P[1];
  r0 = ((uint64_t)p->R20.d[3] << 32) | (uint64_t)p->R20.d[1];
  r1 = ((uint64_t)p->R21.d[3] << 32) | (uint64_t)p->R21.d[1];
  r2 = ((uint64_t)p->R22.d[3] << 32) | (uint64_t)p->R22.d[1];
  s1 = r1 * (5 << 2);
  s2 = r2 * (5 << 2);

  if (leftover < 16) {
    goto poly1305_donna_atmost15bytes;
  }

poly1305_donna_atleast16bytes:
  t0 = CRYPTO_load_u64_le(m + 0);
  t1 = CRYPTO_load_u64_le(m + 8);
  h0 += t0 & 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += t0 & 0xfffffffffff;
  h2 += (t1 >> 24) | ((uint64_t)1 << 40);

poly1305_donna_mul:
  d[0] = add128(add128(mul64x64_128(h0, r0), mul64x64_128(h1, s2)),
                mul64x64_128(h2, s1));
  d[1] = add128(add128(mul64x64_128(h0, r1), mul64x64_128(h1, r0)),
                mul64x64_128(h2, s2));
  d[2] = add128(add128(mul64x64_128(h0, r2), mul64x64_128(h1, r1)),
                mul64x64_128(h2, r0));
  h0 = lo128(d[0]) & 0xfffffffffff;
  c = shr128(d[0], 44);
  d[1] = add128_64(d[1], c);
  h1 = lo128(d[1]) & 0xfffffffffff;
  c = shr128(d[1], 44);
  d[2] = add128_64(d[2], c);
  h2 = lo128(d[2]) & 0x3ffffffffff;
  c = shr128(d[2], 42);
  h0 += c * 5;

  m += 16;
  leftover -= 16;
  if (leftover >= 16) {
    goto poly1305_donna_atleast16bytes;
  }

// final bytes
poly1305_donna_atmost15bytes:
  if (!leftover) {
    goto poly1305_donna_finish;
  }

  m[leftover++] = 1;
  OPENSSL_memset(m + leftover, 0, 16 - leftover);
  leftover = 16;

  t0 = CRYPTO_load_u64_le(m + 0);
  t1 = CRYPTO_load_u64_le(m + 8);
  h0 += t0 & 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += t0 & 0xfffffffffff;
  h2 += (t1 >> 24);

  goto poly1305_donna_mul;

poly1305_donna_finish:
  c = (h0 >> 44);
  h0 &= 0xfffffffffff;
  h1 += c;
  c = (h1 >> 44);
  h1 &= 0xfffffffffff;
  h2 += c;
  c = (h2 >> 42);
  h2 &= 0x3ffffffffff;
  h0 += c * 5;

  g0 = h0 + 5;
  c = (g0 >> 44);
  g0 &= 0xfffffffffff;
  g1 = h1 + c;
  c = (g1 >> 44);
  g1 &= 0xfffffffffff;
  g2 = h2 + c - ((uint64_t)1 << 42);

  c = (g2 >> 63) - 1;
  nc = ~c;
  h0 = (h0 & nc) | (g0 & c);
  h1 = (h1 & nc) | (g1 & c);
  h2 = (h2 & nc) | (g2 & c);

  // pad
  t0 = ((uint64_t)p->R23.d[3] << 32) | (uint64_t)p->R23.d[1];
  t1 = ((uint64_t)p->R24.d[3] << 32) | (uint64_t)p->R24.d[1];
  h0 += (t0 & 0xfffffffffff);
  c = (h0 >> 44);
  h0 &= 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += (t0 & 0xfffffffffff) + c;
  c = (h1 >> 44);
  h1 &= 0xfffffffffff;
  t1 = (t1 >> 24);
  h2 += (t1) + c;

  CRYPTO_store_u64_le(mac + 0, ((h0) | (h1 << 44)));
  CRYPTO_store_u64_le(mac + 8, ((h1 >> 20) | (h2 << 24)));
}